

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.pb.cc
# Opt level: O3

void __thiscall proto2_unittest::TestAny::~TestAny(TestAny *this)

{
  InternalMetadata *this_00;
  Any *this_01;
  ulong uVar1;
  LogMessageFatal local_20;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
    uVar1 = this_00->ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.text_);
    this_01 = (this->field_0)._impl_.any_value_;
    if (this_01 != (Any *)0x0) {
      google::protobuf::Any::~Any(this_01);
    }
    operator_delete(this_01,0x28);
    google::protobuf::RepeatedPtrField<google::protobuf::Any>::~RepeatedPtrField
              (&(this->field_0)._impl_.repeated_any_value_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/any_test.pb.cc"
             ,0xc6,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestAny::~TestAny() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestAny)
  SharedDtor(*this);
}